

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

int __thiscall
particleSamples::read_in_particle_samples_UrQMD_3p3_mixed_event(particleSamples *this)

{
  pretty_ostream *this_00;
  ifstream *piVar1;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_01;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_02;
  char cVar2;
  undefined4 uVar3;
  particleSamples *ppVar4;
  char cVar5;
  istream *piVar6;
  double *pdVar7;
  long lVar8;
  int iVar9;
  anon_struct_120_15_f999644b *paVar10;
  iterator __position_00;
  byte bVar11;
  double dummy;
  int n_particle;
  int urqmd_iso3;
  int urqmd_pid;
  string temp_string;
  double temp_mass;
  int urqmd_charge;
  int parent_proc_type;
  particle_info temp_particle_info;
  stringstream temp1;
  stringstream temp2;
  int local_498;
  int local_494;
  long local_490;
  particleSamples *local_488;
  int local_480;
  int local_47c;
  undefined1 *local_478;
  undefined8 local_470;
  undefined1 local_468 [16];
  ios_base *local_458;
  ios_base *local_450;
  double local_448;
  int local_440;
  int local_43c;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  anon_struct_120_15_f999644b local_3b8;
  vector<particle_info,_std::allocator<particle_info>_> *local_340 [16];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  bVar11 = 0;
  clear_out_previous_record(this,this->full_particle_list_mixed_event);
  local_478 = local_468;
  local_470 = 0;
  local_468[0] = 0;
  if (0 < this->event_buffer_size) {
    piVar1 = &this->inputfile_mixed_event;
    this_00 = &this->messager;
    local_450 = local_138;
    local_458 = aiStack_2c0;
    local_490 = 0;
    local_494 = 0;
    local_488 = this;
    do {
      ppVar4 = local_488;
      cVar2 = (char)piVar1;
      cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)piVar1,(string *)&local_478,cVar5);
      if (((&ppVar4->field_0x3f0)[*(long *)(*(long *)&ppVar4->inputfile_mixed_event + -0x18)] & 2)
          != 0) break;
      this_01 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)ppVar4->full_particle_list_mixed_event;
      local_340[0] = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_340[0]->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_340[0]->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_340[0]->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_01 + 8);
      if (__position._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_01 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (this_01,__position,local_340);
      }
      else {
        *__position._M_current = local_340[0];
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      iVar9 = 0xd;
      do {
        cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar2);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)piVar1,(string *)&local_478,cVar5);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)piVar1,(string *)&local_478,cVar5);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_340,(string *)&local_478,_S_out|_S_in);
      std::istream::operator>>((istream *)local_340,&local_498);
      cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)piVar1,(string *)&local_478,cVar5);
      if (0 < local_498) {
        iVar9 = 0;
        do {
          cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar2);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)piVar1,(string *)&local_478,cVar5);
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_478,_S_out|_S_in);
          piVar6 = std::istream::_M_extract<double>((double *)local_1b8);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = (istream *)std::istream::operator>>(piVar6,&local_47c);
          piVar6 = (istream *)std::istream::operator>>(piVar6,&local_480);
          pdVar7 = (double *)std::istream::operator>>(piVar6,&local_440);
          piVar6 = std::istream::_M_extract<double>(pdVar7);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::operator>>(piVar6,&local_43c);
          piVar6 = std::istream::_M_extract<double>((double *)local_1b8);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::_M_extract<double>((double *)piVar6);
          local_3b8.mass = local_448;
          local_3b8.monval = get_pdg_id(local_488,local_47c,local_480);
          if (local_3b8.monval == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"nev = ",6);
            std::ostream::operator<<(this_00,(int)local_490);
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"error","");
            pretty_ostream::flush(this_00,&local_3d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"nparticles = ",0xd);
            std::ostream::operator<<(this_00,local_498);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ipart = ",10);
            std::ostream::operator<<(this_00,iVar9);
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"error","");
            pretty_ostream::flush(this_00,&local_3f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mass = ",7);
            std::ostream::_M_insert<double>(local_3b8.mass);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", E = ",6);
            std::ostream::_M_insert<double>(local_3b8.E);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", px = ",7);
            std::ostream::_M_insert<double>(local_3b8.px);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", py = ",7);
            std::ostream::_M_insert<double>(local_3b8.py);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", pz = ",7);
            std::ostream::_M_insert<double>(local_3b8.pz);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", t = ",6);
            std::ostream::_M_insert<double>(local_3b8.t);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", x = ",6);
            std::ostream::_M_insert<double>(local_3b8.x);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", y = ",6);
            std::ostream::_M_insert<double>(local_3b8.y);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", z = ",6);
            std::ostream::_M_insert<double>(local_3b8.z);
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"error","");
            pretty_ostream::flush(this_00,&local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Ignore this particle!",0x15);
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"error","");
            pretty_ostream::flush(this_00,&local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p);
            }
          }
          else {
            this_02 = (vector<particle_info,std::allocator<particle_info>> *)
                      (local_488->full_particle_list_mixed_event->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[local_490];
            __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_02 + 8);
            if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_02 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(this_02,__position_00,&local_3b8);
            }
            else {
              paVar10 = &local_3b8;
              for (lVar8 = 0xf; lVar8 != 0; lVar8 = lVar8 + -1) {
                uVar3 = *(undefined4 *)&paVar10->field_0x4;
                (__position_00._M_current)->monval = paVar10->monval;
                *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar3;
                paVar10 = (anon_struct_120_15_f999644b *)
                          ((long)paVar10 + ((ulong)bVar11 * -2 + 1) * 8);
                __position_00._M_current = __position_00._M_current + (ulong)bVar11 * -0x10 + 8;
              }
              *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x78;
            }
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_450);
          iVar9 = iVar9 + 1;
        } while (iVar9 < local_498);
      }
      iVar9 = local_494 + local_498;
      local_490 = local_490 + 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base(local_458);
      local_494 = iVar9;
    } while (iVar9 < local_488->event_buffer_size);
  }
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_3p3_mixed_event() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int n_particle;
    double dummy;
    int parent_proc_type;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3, urqmd_charge;
    double temp_mass;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        getline(inputfile_mixed_event, temp_string);

        if (inputfile_mixed_event.eof()) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // first skip the header
        for (int i = 0; i < 13; i++)
            getline(inputfile_mixed_event, temp_string);
        // then get number of particles within the event
        getline(inputfile_mixed_event, temp_string);
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;
        // then get one useless line
        getline(inputfile_mixed_event, temp_string);

        for (int ipart = 0; ipart < n_particle; ipart++) {
            getline(inputfile_mixed_event, temp_string);
            std::stringstream temp2(temp_string);
            temp2 >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy
                >> dummy >> temp_mass >> urqmd_pid >> urqmd_iso3 >> urqmd_charge
                >> dummy >> dummy >> parent_proc_type;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.t >> temp_particle_info.x
                >> temp_particle_info.y >> temp_particle_info.z
                >> temp_particle_info.E >> temp_particle_info.px
                >> temp_particle_info.py >> temp_particle_info.pz;
            temp_particle_info.mass = temp_mass;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list_mixed_event)[ievent]->push_back(
                    temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}